

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O1

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  cmState *this_01;
  char *pcVar5;
  size_t sVar6;
  pointer pbVar7;
  ulong uVar8;
  pointer pbVar9;
  ulong uVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string notSet;
  string message;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  string *local_b0;
  string local_a8;
  string local_88;
  pointer local_68;
  ulong local_60;
  cmVariableRequiresCommand *local_58;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (local_60 < 0x41) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar2 = cmMakefile::IsOn((this->super_cmCommand).Makefile,name);
    if (bVar2) {
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_b0 = name;
      this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9) < 0x41) {
        bVar2 = true;
        bVar4 = false;
      }
      else {
        bVar2 = true;
        bVar4 = false;
        uVar8 = 2;
        uVar10 = 3;
        local_68 = pbVar7;
        local_58 = this;
        do {
          bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,pbVar9 + uVar8);
          if (!bVar3) {
            std::__cxx11::string::_M_append
                      ((char *)&local_d0,
                       (ulong)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_d0);
            pcVar5 = cmState::GetCacheEntryValue
                               (this_01,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar8);
            if (pcVar5 == (char *)0x0) {
              bVar2 = false;
            }
            else {
              pbVar7 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ADVANCED","");
              bVar2 = cmState::GetCacheEntryPropertyAsBool(this_01,pbVar7 + uVar8,&local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if (bVar2 != false) {
              bVar4 = true;
            }
            bVar2 = false;
            this = local_58;
          }
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          bVar3 = uVar10 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9
                                  >> 5);
          pbVar7 = local_68;
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar3);
      }
      pcVar5 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,pbVar7 + 1);
      bVar11 = pcVar5 == (char *)0x0;
      bVar3 = bVar11;
      if (!bVar11 && !bVar2) {
        this_00 = (this->super_cmCommand).Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar6 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + sVar6);
        bVar3 = cmMakefile::IsOn(this_00,&local_50);
      }
      if ((!bVar11 && bVar2 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar3 != false) {
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar7 + 1,bVar2);
      }
      if (bVar2 == false) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Variable assertion failed:\n","");
        pcVar1 = (local_b0->_M_dataplus)._M_p;
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,pcVar1,pcVar1 + local_b0->_M_string_length);
        std::__cxx11::string::append((char *)local_f0);
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_f0[0]);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_d0._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_a8);
        pcVar1 = (local_b0->_M_dataplus)._M_p;
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,pcVar1,pcVar1 + local_b0->_M_string_length);
        std::__cxx11::string::append((char *)local_f0);
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_f0[0]);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        if (bVar4) {
          std::__cxx11::string::append((char *)&local_a8);
        }
        cmSystemTools::Error(&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return 0x40 < local_60;
}

Assistant:

bool cmVariableRequiresCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& testVariable = args[0];
  if (!this->Makefile->IsOn(testVariable)) {
    return true;
  }
  std::string const& resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (!this->Makefile->IsOn(args[i])) {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if (state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED")) {
        hasAdvanced = true;
      }
    }
  }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if (!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar))) {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
  }

  if (!requirementsMet) {
    std::string message = "Variable assertion failed:\n";
    message +=
      testVariable + " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if (hasAdvanced) {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
    }
    cmSystemTools::Error(message);
  }

  return true;
}